

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall ON_SubDVertex::MarkedFaceCount(ON_SubDVertex *this)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar2 = this->m_face_count;
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  else {
    uVar4 = 0;
    uVar3 = 0;
    do {
      if (this->m_faces[uVar4] != (ON_SubDFace *)0x0) {
        bVar1 = ON_ComponentStatus::RuntimeMark
                          (&(this->m_faces[uVar4]->super_ON_SubDComponentBase).m_status);
        uVar3 = uVar3 + bVar1;
        uVar2 = this->m_face_count;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar2);
  }
  return uVar3;
}

Assistant:

unsigned int ON_SubDVertex::MarkedFaceCount() const
{
  unsigned int mark_count = 0;
  for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
  {
    const ON_SubDFace* f = m_faces[vfi];
    if (nullptr != f && f->m_status.RuntimeMark())
      ++mark_count;
  }
  return mark_count;
}